

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

ErProc * __thiscall yactfr::internal::DsPktProc::operator[](DsPktProc *this,TypeId id)

{
  const_iterator cVar1;
  pointer puVar2;
  TypeId local_8;
  
  puVar2 = (this->_erProcsVec).
           super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (id < (ulong)((long)(this->_erProcsVec).
                         super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    puVar2 = puVar2 + id;
  }
  else {
    local_8 = id;
    cVar1 = std::
            _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->_erProcsMap)._M_h,&local_8);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      return (ErProc *)0x0;
    }
    puVar2 = (pointer)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
                             ._M_cur + 0x10);
  }
  return (ErProc *)
         ((_Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
           )(puVar2->_M_t).
            super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
            ._M_t).
         super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
  ;
}

Assistant:

const ErProc *DsPktProc::operator[](const TypeId id) const noexcept
{
    if (id < _erProcsVec.size()) {
        return _erProcsVec[id].get();
    }

    // fall back on map
    auto erProcIt = _erProcsMap.find(id);

    if (erProcIt == _erProcsMap.end()) {
        return nullptr;
    }

    return erProcIt->second.get();
}